

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void visualizeClassicSudoku(SudokuGitter *gitter)

{
  ClassicSudokuVisualizer visualizer;
  string local_a0;
  SudokuGitter local_80;
  ClassicSudokuVisualizer local_58;
  
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::vector(&local_80.cells,&gitter->cells);
  local_80.quadHeight = gitter->quadHeight;
  local_80.elements = gitter->elements;
  local_80.quadWidth = gitter->quadWidth;
  ClassicSudokuVisualizer::ClassicSudokuVisualizer(&local_58,&local_80);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_80.cells);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"output/classic.html","");
  ClassicSudokuVisualizer::createHTML(&local_58,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.html_template._M_dataplus._M_p != &local_58.html_template.field_2) {
    operator_delete(local_58.html_template._M_dataplus._M_p);
  }
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector((vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
             *)&local_58);
  return;
}

Assistant:

void visualizeClassicSudoku(SudokuGitter gitter){
    ClassicSudokuVisualizer visualizer = ClassicSudokuVisualizer(gitter);
    visualizer.createHTML("output/classic.html");
}